

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int iVar1;
  U32 *rep_00;
  long in_RDI;
  ZSTD_matchState_t *in_R8;
  U32 mls;
  void *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  size_t local_8;
  
  iVar1 = *(int *)(in_RDI + 0x110);
  rep_00 = (U32 *)(ulong)(iVar1 - 4);
  switch(rep_00) {
  default:
    local_8 = ZSTD_compressBlock_doubleFast_extDict_4
                        (in_R8,(seqStore_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),rep_00,
                         in_stack_ffffffffffffffb8,0x19ad04);
    break;
  case (U32 *)0x1:
    local_8 = ZSTD_compressBlock_doubleFast_extDict_5
                        (in_R8,(seqStore_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),rep_00,
                         in_stack_ffffffffffffffb8,0x19ad29);
    break;
  case (U32 *)0x2:
    local_8 = ZSTD_compressBlock_doubleFast_extDict_6
                        (in_R8,(seqStore_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),rep_00,
                         in_stack_ffffffffffffffb8,0x19ad4e);
    break;
  case (U32 *)0x3:
    local_8 = ZSTD_compressBlock_doubleFast_extDict_7
                        (in_R8,(seqStore_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),rep_00,
                         in_stack_ffffffffffffffb8,0x19ad73);
  }
  return local_8;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_extDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_extDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_extDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_extDict_7(ms, seqStore, rep, src, srcSize);
    }
}